

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int validop(int op,TValue *v1,TValue *v2)

{
  int iVar1;
  double local_40;
  int local_34;
  bool local_2d;
  Value local_28;
  lua_Integer i;
  TValue *v2_local;
  TValue *v1_local;
  int op_local;
  
  i = (lua_Integer)v2;
  v2_local = v1;
  v1_local._0_4_ = op;
  if ((op == 3) || (op - 5U < 2)) {
    if ((v2->tt_ & 0xf) != 3) {
      __assert_fail("(((((((v2))->tt_)) & 0x0F)) == (3))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x4f1,"int validop(int, TValue *, TValue *)");
    }
    if (v2->tt_ == 0x13) {
      if (v2->tt_ != 0x13) {
        __assert_fail("((((v2))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x4f1,"int validop(int, TValue *, TValue *)");
      }
      local_40 = (double)(v2->value_).i;
    }
    else {
      if (v2->tt_ != 3) {
        __assert_fail("((((v2))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x4f1,"int validop(int, TValue *, TValue *)");
      }
      local_40 = (v2->value_).n;
    }
    return (uint)(local_40 != 0.0);
  }
  if ((4 < op - 7U) && (op != 0xd)) {
    return 1;
  }
  if (v1->tt_ == 0x13) {
    if (v1->tt_ != 0x13) {
      __assert_fail("((((v1))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x4ee,"int validop(int, TValue *, TValue *)");
    }
    local_28 = v1->value_;
  }
  else {
    iVar1 = luaV_tointeger(v1,&local_28.i,F2Ieq);
    local_2d = false;
    if (iVar1 == 0) goto LAB_00185738;
  }
  if (*(short *)(i + 8) == 0x13) {
    if (*(short *)(i + 8) != 0x13) {
      __assert_fail("((((v2))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x4ee,"int validop(int, TValue *, TValue *)");
    }
    local_34 = 1;
  }
  else {
    local_34 = luaV_tointeger((TValue *)i,&local_28.i,F2Ieq);
  }
  local_2d = local_34 != 0;
LAB_00185738:
  return (uint)local_2d;
}

Assistant:

static int validop (int op, TValue *v1, TValue *v2) {
  switch (op) {
    case LUA_OPBAND: case LUA_OPBOR: case LUA_OPBXOR:
    case LUA_OPSHL: case LUA_OPSHR: case LUA_OPBNOT: {  /* conversion errors */
      lua_Integer i;
      return (tointeger(v1, &i) && tointeger(v2, &i));
    }
    case LUA_OPDIV: case LUA_OPIDIV: case LUA_OPMOD:  /* division by 0 */
      return (nvalue(v2) != 0);
    default: return 1;  /* everything else is valid */
  }
}